

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::ParallelDelaunay3d::set_vertices(ParallelDelaunay3d *this,index_t nb_vertices,double *vertices)

{
  int *piVar1;
  index_t *piVar2;
  Delaunay3dThread *pDVar3;
  pointer pdVar4;
  pointer puVar5;
  pointer pSVar6;
  Thread *pTVar7;
  Thread *pTVar8;
  pointer piVar9;
  pointer puVar10;
  index_t pool_end;
  undefined8 uVar11;
  bool bVar12;
  Stopwatch *pSVar13;
  clock_t cVar14;
  ostream *poVar15;
  Delaunay3dThread *pDVar16;
  ThreadManager *pTVar17;
  vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>> *pvVar18;
  pointer pSVar19;
  pointer piVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  pointer piVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  ParallelDelaunay3d *pPVar31;
  int iVar32;
  ulong uVar33;
  index_t pool_begin;
  int iVar34;
  uint uVar35;
  tms end;
  undefined1 local_b8 [32];
  ParallelDelaunay3d *local_98;
  Stopwatch *local_90;
  vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>> *local_88;
  vector<unsigned_int> *local_80;
  vector<int> *local_78;
  ulong local_70;
  double local_68;
  vector<int> *local_60;
  ulong local_58;
  string local_50;
  
  uVar33 = (ulong)nb_vertices;
  if (this->benchmark_mode_ == true) {
    pSVar13 = (Stopwatch *)operator_new(0x50);
    local_b8._0_8_ = local_b8 + 0x10;
    local_90 = pSVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelInternal","");
    Stopwatch::Stopwatch(pSVar13,(string *)local_b8,true);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  else {
    local_90 = (Stopwatch *)0x0;
  }
  local_98 = this;
  if (this->weighted_ == true) {
    std::vector<double,_GEO::Memory::aligned_allocator<double,_64>_>::resize
              (&(this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>,
               uVar33);
    if (nb_vertices != 0) {
      pdVar4 = (this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
               super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = 0;
      do {
        iVar34 = (int)uVar23;
        *(double *)((long)pdVar4 + uVar23 * 2) =
             vertices[iVar34 + 2] * vertices[iVar34 + 2] +
             vertices[iVar34 + 1] * vertices[iVar34 + 1] +
             vertices[uVar23 & 0xffffffff] * vertices[uVar23 & 0xffffffff] +
             vertices[iVar34 + 3] * vertices[iVar34 + 3];
        uVar23 = uVar23 + 4;
      } while (uVar33 * 4 - uVar23 != 0);
    }
  }
  pPVar31 = local_98;
  Delaunay::set_vertices(&local_98->super_Delaunay,nb_vertices,vertices);
  uVar23 = (ulong)(nb_vertices * 7);
  local_60 = &pPVar31->cell_to_v_store_;
  local_b8._0_4_ = 0xffffffff;
  local_88 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)uVar33;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_60->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)local_b8);
  local_78 = &pPVar31->cell_to_cell_store_;
  local_b8._0_4_ = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)local_b8);
  local_80 = &pPVar31->cell_next_;
  local_b8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::_M_fill_assign
            (&local_80->
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar23,
             (value_type_conflict1 *)local_b8);
  local_b8[0] = 0xff;
  local_70 = uVar23;
  std::vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>::_M_fill_assign
            (&(pPVar31->cell_thread_).
              super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>,uVar23
             ,local_b8);
  if ((pPVar31->super_Delaunay).do_reorder_ == true) {
    compute_BRIO_order((index_t)local_88,(pPVar31->super_Delaunay).vertices_,&pPVar31->reorder_,3,
                       (uint)(byte)(pPVar31->super_Delaunay).super_Counted.field_0xc,0x40,0.125,
                       &pPVar31->levels_);
  }
  else {
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::resize
              (&(pPVar31->reorder_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar33
              );
    if ((int)local_88 != 0) {
      puVar5 = (pPVar31->reorder_).
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar25 = 0;
      do {
        puVar5[lVar25] = (uint)lVar25;
        lVar25 = lVar25 + 1;
      } while (uVar33 != lVar25);
    }
  }
  local_68 = 0.0;
  if (pPVar31->benchmark_mode_ == true) {
    cVar14 = times((tms *)local_b8);
    lVar25 = (local_90->W_).start_user_;
    local_b8._0_8_ = (Delaunay3dThread *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelInternal1","");
    poVar15 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"BRIO sorting:",0xd);
    local_68 = (double)(cVar14 - lVar25) / 100.0;
    poVar15 = std::ostream::_M_insert<double>(local_68);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  uVar21 = 1;
  if (::(anonymous_namespace)::thread_manager_ != 0) {
    uVar21 = ::(anonymous_namespace)::max_threads_;
  }
  uVar33 = 1;
  if (::(anonymous_namespace)::multithreading_enabled_ != '\0') {
    uVar33 = (ulong)uVar21;
  }
  local_58 = (local_70 & 0xffffffff) / uVar33;
  local_88 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)&pPVar31->threads_;
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  _M_erase_at_end((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                   *)local_88,
                  (pPVar31->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  iVar34 = (int)uVar33;
  iVar29 = 0;
  pool_begin = 0;
  do {
    pool_end = (int)local_58 + pool_begin;
    if (iVar34 + -1 == iVar29) {
      pool_end = (index_t)local_70;
    }
    pDVar16 = (Delaunay3dThread *)operator_new(0x2f80);
    Delaunay3dThread::Delaunay3dThread(pDVar16,local_98,pool_begin,pool_end);
    piVar1 = &(pDVar16->super_Thread).super_Counted.nb_refs_;
    *piVar1 = *piVar1 + 1;
    local_b8._0_8_ = pDVar16;
    std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
    emplace_back<GEO::SmartPointer<GEO::Thread>>(local_88,(SmartPointer<GEO::Thread> *)local_b8);
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)0x0) {
      piVar1 = (int *)(local_b8._0_8_ + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)local_b8._0_8_ + 8))();
      }
    }
    pPVar31 = local_98;
    iVar29 = iVar29 + 1;
    pool_begin = pool_end;
  } while (iVar34 + (uint)(iVar34 == 0) != iVar29);
  puVar5 = (local_98->levels_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar34 = (int)((ulong)((long)(local_98->levels_).
                               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               .
                               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 2);
  uVar21 = iVar34 - 1;
  uVar33 = 1;
  if (1 < uVar21) {
    lVar25 = 0;
    do {
      if (999 < puVar5[lVar25 + 1]) {
        uVar33 = (ulong)((int)lVar25 + 1);
        goto LAB_001555ae;
      }
      lVar25 = lVar25 + 1;
    } while (iVar34 + -2 != (int)lVar25);
    uVar33 = (ulong)uVar21;
  }
LAB_001555ae:
  if (local_98->benchmark_mode_ == true) {
    pDVar16 = (Delaunay3dThread *)(local_b8 + 0x10);
    local_b8._0_8_ = pDVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar15 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Using ",6);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," levels",7);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar16) {
      operator_delete((void *)local_b8._0_8_);
    }
    local_b8._0_8_ = pDVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar15 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Levels 0 - ",0xb);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,": bootstraping with first levels in sequential mode",0x33);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar16) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pDVar16 = (Delaunay3dThread *)
            ((pPVar31->threads_).
             super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->pointer_;
  Delaunay3dThread::create_first_tetrahedron(pDVar16);
  puVar5 = (pPVar31->levels_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar21 = puVar5[uVar33];
  pDVar16->work_begin_ = *puVar5;
  pDVar16->work_end_ = uVar21 - 1;
  (*(pDVar16->super_Thread).super_Counted._vptr_Counted[2])(pDVar16);
  uVar23 = uVar33;
  if ((uint)uVar33 <
      (int)((ulong)((long)(pPVar31->levels_).
                          super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                          .
                          super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pPVar31->levels_).
                         super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                         .
                         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1U) {
    do {
      if (pPVar31->benchmark_mode_ == true) {
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
        poVar15 = Logger::out((string *)local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Level ",6);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," : start",8);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      puVar5 = (local_98->levels_).
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar21 = puVar5[uVar23];
      uVar35 = puVar5[uVar23 + 1];
      pSVar19 = (local_98->threads_).
                super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (local_98->threads_).
               super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar26 = (long)pSVar6 - (long)pSVar19 >> 3;
      if (pSVar6 != pSVar19) {
        uVar28 = 0;
        uVar22 = uVar21;
        do {
          uVar27 = uVar22 + (int)((ulong)(uVar35 - uVar21) / (uVar26 & 0xffffffff));
          if (uVar26 - 1 == uVar28) {
            uVar27 = uVar35;
          }
          pTVar7 = pSVar19[uVar28].pointer_;
          if ((int)uVar28 != 0 && uVar23 == uVar33) {
            *(index_t *)&pTVar7[6].super_Counted._vptr_Counted = pDVar16->max_used_t_;
            *(index_t *)&pTVar7[5].super_Counted.field_0xc = pDVar16->max_t_;
            *(index_t *)((long)&pTVar7[9].super_Counted._vptr_Counted + 4) = pDVar16->v1_;
            pTVar7[9].super_Counted.nb_refs_ = pDVar16->v2_;
            *(index_t *)&pTVar7[9].super_Counted.field_0xc = pDVar16->v3_;
            *(index_t *)&pTVar7[10].super_Counted._vptr_Counted = pDVar16->v4_;
          }
          *(uint *)&pTVar7[0xd].super_Counted._vptr_Counted = uVar22;
          *(uint *)((long)&pTVar7[0xd].super_Counted._vptr_Counted + 4) = uVar27 - 1;
          uVar28 = uVar28 + 1;
          uVar22 = uVar27;
        } while ((uVar28 & 0xffffffff) < uVar26);
      }
      uVar23 = uVar23 + 1;
      ::(anonymous_namespace)::running_threads_invocations_ =
           ::(anonymous_namespace)::running_threads_invocations_ + 1;
      pTVar17 = SmartPointer<GEO::ThreadManager>::operator->
                          ((SmartPointer<GEO::ThreadManager> *)
                           &::(anonymous_namespace)::thread_manager_);
      (*(pTVar17->super_Counted)._vptr_Counted[2])(pTVar17,local_88);
      ::(anonymous_namespace)::running_threads_invocations_ =
           ::(anonymous_namespace)::running_threads_invocations_ + -1;
      pPVar31 = local_98;
    } while (uVar23 < (int)((ulong)((long)(local_98->levels_).
                                          super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                          .
                                          super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(local_98->levels_).
                                         super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                         .
                                         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1);
  }
  if (pPVar31->benchmark_mode_ == true) {
    pSVar19 = (pPVar31->threads_).
              super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar18 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
               *)0x0;
    if ((pPVar31->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar19) {
      uVar21 = 1;
      uVar33 = 0;
      do {
        pTVar7 = pSVar19[uVar33].pointer_;
        local_b8._0_8_ = local_b8 + 0x10;
        local_88 = pvVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
        poVar15 = Logger::out((string *)local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"thread ",7);
        *(undefined8 *)(&poVar15->field_0x10 + (long)poVar15->_vptr_basic_ostream[-3]) = 3;
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," : ",3);
        *(undefined8 *)(&poVar15->field_0x10 + (long)poVar15->_vptr_basic_ostream[-3]) = 3;
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," rollbacks  ",0xc);
        *(undefined8 *)(&poVar15->field_0x10 + (long)poVar15->_vptr_basic_ostream[-3]) = 3;
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," restarted locate",0x11);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_);
        }
        pvVar18 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                   *)(ulong)(uint)((int)local_88 + *(int *)&pTVar7[0x11].super_Counted.field_0xc);
        uVar33 = (ulong)uVar21;
        pSVar19 = (local_98->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar21 = uVar21 + 1;
      } while (uVar33 < (ulong)((long)(local_98->threads_).
                                      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar19 >>
                               3));
    }
    pDVar3 = (Delaunay3dThread *)(local_b8 + 0x10);
    local_b8._0_8_ = pDVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar15 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"------------------",0x12);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
      operator_delete((void *)local_b8._0_8_);
    }
    local_b8._0_8_ = pDVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar15 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"total: ",7);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," rollbacks  ",0xc);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," restarted locate",0x11);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    pPVar31 = local_98;
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
      operator_delete((void *)local_b8._0_8_);
      pPVar31 = local_98;
    }
  }
  pSVar19 = (pPVar31->threads_).
            super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar31->threads_).
      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pSVar19) {
    iVar34 = 0;
    lVar25 = 0;
  }
  else {
    iVar34 = 0;
    uVar33 = 0;
    uVar23 = 1;
    do {
      pTVar7 = pSVar19[uVar33].pointer_;
      uVar21 = *(uint *)&pTVar7[0xd].super_Counted._vptr_Counted;
      uVar35 = *(uint *)((long)&pTVar7[0xd].super_Counted._vptr_Counted + 4);
      iVar29 = (uVar35 - uVar21) + 1;
      if ((uVar21 & uVar35) == 0xffffffff) {
        iVar29 = 0;
      }
      iVar32 = (int)uVar23;
      if (iVar32 != 1) {
        pTVar8 = pSVar19[iVar32 - 2].pointer_;
        *(undefined4 *)&pTVar7[6].super_Counted._vptr_Counted =
             *(undefined4 *)&pTVar8[6].super_Counted._vptr_Counted;
        *(undefined4 *)&pTVar7[5].super_Counted.field_0xc =
             *(undefined4 *)&pTVar8[5].super_Counted.field_0xc;
        *(undefined4 *)((long)&pTVar7[9].super_Counted._vptr_Counted + 4) =
             *(undefined4 *)((long)&pTVar8[9].super_Counted._vptr_Counted + 4);
        pTVar7[9].super_Counted.nb_refs_ = pTVar8[9].super_Counted.nb_refs_;
        *(undefined4 *)&pTVar7[9].super_Counted.field_0xc =
             *(undefined4 *)&pTVar8[9].super_Counted.field_0xc;
        *(undefined4 *)&pTVar7[10].super_Counted._vptr_Counted =
             *(undefined4 *)&pTVar8[10].super_Counted._vptr_Counted;
      }
      iVar34 = iVar34 + iVar29;
      (*(pTVar7->super_Counted)._vptr_Counted[2])();
      pSVar19 = (pPVar31->threads_).
                super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar25 = (long)(pPVar31->threads_).
                     super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar19;
      bVar12 = uVar23 < (ulong)(lVar25 >> 3);
      uVar33 = uVar23;
      uVar23 = (ulong)(iVar32 + 1);
    } while (bVar12);
  }
  if (iVar34 != 0) {
    pTVar7 = pSVar19->pointer_;
    lVar25 = *(long *)((long)&pSVar19[-1].pointer_ + lVar25);
    *(undefined4 *)&pTVar7[6].super_Counted._vptr_Counted = *(undefined4 *)(lVar25 + 0x60);
    *(undefined4 *)&pTVar7[5].super_Counted.field_0xc = *(undefined4 *)(lVar25 + 0x5c);
    *(undefined4 *)((long)&pTVar7[9].super_Counted._vptr_Counted + 4) =
         *(undefined4 *)(lVar25 + 0x94);
    pTVar7[9].super_Counted.nb_refs_ = *(int *)(lVar25 + 0x98);
    *(undefined4 *)&pTVar7[9].super_Counted.field_0xc = *(undefined4 *)(lVar25 + 0x9c);
    *(undefined4 *)&pTVar7[10].super_Counted._vptr_Counted = *(undefined4 *)(lVar25 + 0xa0);
  }
  if (pPVar31->benchmark_mode_ == true) {
    if (iVar34 == 0) {
      local_b8._0_8_ = (Delaunay3dThread *)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar15 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"All the points were inserted in parallel mode",0x2d);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10))
      goto LAB_00155e12;
    }
    else {
      pDVar3 = (Delaunay3dThread *)(local_b8 + 0x10);
      local_b8._0_8_ = pDVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar15 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"Local thread memory overflow occurred:",0x26);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
        operator_delete((void *)local_b8._0_8_);
      }
      local_b8._0_8_ = pDVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar15 = Logger::out((string *)local_b8);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15," points inserted in sequential mode",0x23);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
LAB_00155e12:
        operator_delete((void *)local_b8._0_8_);
      }
    }
  }
  if (pPVar31->benchmark_mode_ == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DelInternal2","");
    poVar15 = Logger::out(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Core insertion algo:",0x14);
    cVar14 = times((tms *)local_b8);
    poVar15 = std::ostream::_M_insert<double>
                        ((double)(cVar14 - (local_90->W_).start_user_) / 100.0 - local_68);
    std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (local_90 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(local_90);
    operator_delete(local_90);
  }
  if (pPVar31->debug_mode_ == true) {
    if ((pPVar31->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pPVar31->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar33 = 1;
      do {
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," : ",3);
        pPVar31 = local_98;
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        bVar12 = uVar33 < (ulong)((long)(pPVar31->threads_).
                                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar31->threads_).
                                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar33 = (ulong)((int)uVar33 + 1);
      } while (bVar12);
    }
    Delaunay3dThread::check_combinatorics(pDVar16,pPVar31->verbose_debug_mode_);
    Delaunay3dThread::check_geometry(pDVar16,pPVar31->verbose_debug_mode_);
  }
  pSVar13 = local_90;
  if (pPVar31->benchmark_mode_ == true) {
    pSVar13 = (Stopwatch *)operator_new(0x50);
    local_b8._0_8_ = (Delaunay3dThread *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
    Stopwatch::Stopwatch(pSVar13,(string *)local_b8,true);
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  local_90 = pSVar13;
  if (pDVar16->max_t_ == 0) {
    uVar21 = 0;
    pvVar18 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
               *)0x0;
  }
  else {
    uVar23 = 0;
    uVar35 = 0;
    uVar33 = 0;
    do {
      if ((((pPVar31->super_Delaunay).keep_infinite_ == true) &&
          ((pDVar16->cell_next_->
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar23] == 0xfffffffe)) ||
         (bVar12 = Delaunay3dThread::tet_is_real(pDVar16,(index_t)uVar23), bVar12)) {
        uVar21 = (uint)uVar33;
        if (uVar23 != uVar33) {
          piVar24 = (local_60->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar22 = (index_t)uVar23 * 4;
          piVar9 = piVar24 + uVar22;
          uVar11 = *(undefined8 *)(piVar9 + 2);
          piVar24 = piVar24 + uVar21 * 4;
          *(undefined8 *)piVar24 = *(undefined8 *)piVar9;
          *(undefined8 *)(piVar24 + 2) = uVar11;
          piVar24 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar9 = piVar24 + uVar22;
          uVar11 = *(undefined8 *)(piVar9 + 2);
          piVar24 = piVar24 + uVar21 * 4;
          *(undefined8 *)piVar24 = *(undefined8 *)piVar9;
          *(undefined8 *)(piVar24 + 2) = uVar11;
        }
        (local_80->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] = uVar21;
        uVar33 = (ulong)(uVar21 + 1);
      }
      else {
        (local_80->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] = 0xffffffff;
        uVar35 = uVar35 + 1;
      }
      uVar21 = (uint)uVar33;
      uVar23 = uVar23 + 1;
    } while (uVar23 < pDVar16->max_t_);
    pvVar18 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
               *)(ulong)uVar35;
  }
  uVar35 = uVar21 * 4;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&local_60->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,(ulong)uVar35);
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,(ulong)uVar35);
  if (uVar35 != 0) {
    piVar9 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (local_80->
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar33 = 0;
    do {
      piVar9[uVar33] = puVar5[(uint)piVar9[uVar33]];
      uVar33 = uVar33 + 1;
    } while (uVar35 != uVar33);
  }
  bVar12 = (pPVar31->super_Delaunay).keep_infinite_;
  if (bVar12 != false) {
    local_70 = CONCAT71(local_70._1_7_,bVar12);
    (pPVar31->super_Delaunay).nb_finite_cells_ = 0;
    piVar9 = (pDVar16->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (pPVar31->cell_next_).
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar24 = (pPVar31->cell_to_v_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar20 = (pPVar31->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar33 = 0;
    uVar23 = (ulong)uVar21;
    do {
      uVar26 = (ulong)(uint)((int)uVar33 * 4);
      if (-1 < piVar9[uVar26]) {
        puVar10 = (local_80->
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar34 = (int)uVar26;
          if (((piVar9[iVar34 + 1] < 0) || (piVar9[iVar34 + 2] < 0)) || (piVar9[iVar34 + 3] < 0))
          break;
          puVar10[uVar33] = (uint)uVar33;
          piVar2 = &(pPVar31->super_Delaunay).nb_finite_cells_;
          *piVar2 = *piVar2 + 1;
          uVar33 = (ulong)((uint)uVar33 + 1);
          uVar26 = (ulong)(iVar34 + 4);
        } while (-1 < piVar9[uVar26]);
      }
      puVar10 = (local_80->
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar22 = (uint)uVar23;
      uVar27 = uVar22 * 4;
      while( true ) {
        uVar22 = uVar22 - 1;
        uVar30 = uVar27 - 4;
        uVar23 = (ulong)uVar22;
        if (((-1 < piVar9[uVar30]) && (-1 < piVar9[uVar27 - 3])) &&
           ((-1 < piVar9[uVar27 - 2] && (-1 < piVar9[uVar27 - 1])))) break;
        puVar10[uVar23] = uVar22;
        uVar27 = uVar30;
      }
      uVar27 = (uint)uVar33;
      pPVar31 = local_98;
      if (uVar22 < uVar27) goto LAB_00156296;
      puVar5[uVar33] = uVar22;
      puVar5[uVar23] = uVar27;
      piVar2 = &(local_98->super_Delaunay).nb_finite_cells_;
      *piVar2 = *piVar2 + 1;
      lVar25 = 0;
      do {
        iVar34 = piVar20[uVar26 + lVar25];
        piVar20[uVar26 + lVar25] = piVar20[(ulong)uVar30 + lVar25];
        piVar20[(ulong)uVar30 + lVar25] = iVar34;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      lVar25 = 0;
      do {
        iVar34 = piVar24[uVar26 + lVar25];
        piVar24[uVar26 + lVar25] = piVar24[(ulong)uVar30 + lVar25];
        piVar24[(ulong)uVar30 + lVar25] = iVar34;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 4);
      uVar33 = (ulong)(uVar27 + 1);
    } while( true );
  }
LAB_001562d0:
  if (pPVar31->benchmark_mode_ == true) {
    pDVar16 = (Delaunay3dThread *)(local_b8 + 0x10);
    local_b8._0_8_ = pDVar16;
    if (bVar12 == false) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
      poVar15 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Removed ",8);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15," tets (free list and infinite)",0x1e);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
      poVar15 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Removed ",8);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," tets (free list)",0x11);
      std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
    }
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar16) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pSVar13 = local_90;
  if (local_90 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(local_90);
    operator_delete(pSVar13);
  }
  piVar9 = (pPVar31->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar24 = (pointer)((long)(pPVar31->cell_to_v_store_).
                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 & 0x3fffffffc);
  if (piVar24 != (pointer)0x0) {
    piVar24 = piVar9;
  }
  piVar9 = (pPVar31->cell_to_cell_store_).
           super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar20 = (pointer)((long)(pPVar31->cell_to_cell_store_).
                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 & 0x3fffffffc);
  if (piVar20 != (pointer)0x0) {
    piVar20 = piVar9;
  }
  (*(pPVar31->super_Delaunay).super_Counted._vptr_Counted[9])(pPVar31,(ulong)uVar21,piVar24,piVar20)
  ;
  return;
LAB_00156296:
  local_88 = pvVar18;
  if (uVar35 != 0) {
    piVar9 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (local_80->
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar33 = 0;
    do {
      piVar9[uVar33] = puVar5[(uint)piVar9[uVar33]];
      uVar33 = uVar33 + 1;
    } while (uVar35 != uVar33);
  }
  goto LAB_001562d0;
}

Assistant:

void ParallelDelaunay3d::set_vertices(
        index_t nb_vertices, const double* vertices
    ) {
        Stopwatch* W = nullptr ;
        if(benchmark_mode_) {
            W = new Stopwatch("DelInternal");
        }

        if(weighted_) {
            heights_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                // Client code uses 4d embedding with ti = sqrt(W - wi)
                //   where W = max(wi)
                // We recompute the standard "shifted" lifting on
                // the paraboloid from it.
                // (we use wi - W, everything is shifted by W, but
                // we do not care since the power diagram is invariant
                // by a translation of all weights).
                double w = -geo_sqr(vertices[4 * i + 3]);
                heights_[i] = -w +
                    geo_sqr(vertices[4 * i]) +
                    geo_sqr(vertices[4 * i + 1]) +
                    geo_sqr(vertices[4 * i + 2]);
            }
        }
        Delaunay::set_vertices(nb_vertices, vertices);

        index_t expected_tetra = nb_vertices * 7;
    
        // Allocate the tetrahedra
        cell_to_v_store_.assign(expected_tetra * 4,-1);
        cell_to_cell_store_.assign(expected_tetra * 4,-1);
        cell_next_.assign(expected_tetra,index_t(-1));
        cell_thread_.assign(expected_tetra,thread_index_t(-1));

        // Reorder the points
        if(do_reorder_) {
            compute_BRIO_order(
                nb_vertices, vertex_ptr(0), reorder_,
		3, dimension(),
                64, 0.125,
                &levels_
            );        
        } else {
            reorder_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                reorder_[i] = i;
            }
            geo_debug_assert(levels_[0] == 0);
            geo_debug_assert(levels_[levels_.size()-1] == nb_vertices);
        }

        double sorting_time = 0;
        if(benchmark_mode_) {
            sorting_time = W->elapsed_time();
            Logger::out("DelInternal1") << "BRIO sorting:"
                                       << sorting_time
                                       << std::endl;
        } 

        // Create the threads
        index_t nb_threads = Process::maximum_concurrent_threads();
        index_t pool_size = expected_tetra / nb_threads;
        index_t pool_begin = 0;
        threads_.clear();
        for(index_t t=0; t<nb_threads; ++t) {
            index_t pool_end = 
                (t == nb_threads - 1) ? expected_tetra : pool_begin + pool_size;
            threads_.push_back(
                new Delaunay3dThread(this, pool_begin, pool_end)
            );
            pool_begin = pool_end;
        }


        // Create first tetrahedron and triangulate first set of points 
        // in sequential mode.


        index_t lvl = 1;
        while(lvl < (levels_.size() - 1) && levels_[lvl] < 1000) {
            ++lvl;
        }

        if(benchmark_mode_) {
            Logger::out("PDEL")
                << "Using " << levels_.size()-1 << " levels" << std::endl;
            Logger::out("PDEL") 
                << "Levels 0 - " << lvl-1 
                << ": bootstraping with first levels in sequential mode"
                << std::endl;
        }
        Delaunay3dThread* thread0 = 
                    static_cast<Delaunay3dThread*>(threads_[0].get());
        thread0->create_first_tetrahedron();
        thread0->set_work(levels_[0], levels_[lvl]);
        thread0->run();

        index_t first_lvl = lvl;

        // Insert points in all BRIO levels
        for(; lvl<levels_.size()-1; ++lvl) {

            if(benchmark_mode_) {
                Logger::out("PDEL") << "Level " 
                                    << lvl << " : start" << std::endl;
            }

            index_t lvl_b = levels_[lvl];
            index_t lvl_e = levels_[lvl+1];
            index_t work_size = (lvl_e - lvl_b)/index_t(threads_.size());

            // Initialize threads
            index_t b = lvl_b;
            for(index_t t=0; t<threads_.size(); ++t) {
                index_t e = t == threads_.size()-1 ? lvl_e : b+work_size;
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                
                // Copy the indices of the first created tetrahedron
                // and the maximum valid tetrahedron index max_t_
                if(lvl == first_lvl && t!=0) {
                    thread->initialize_from(thread0);
                }
                thread->set_work(b,e);
                b = e;
            }
            Process::run_threads(threads_);
        }


        if(benchmark_mode_) {
            index_t tot_rollbacks = 0 ;
            index_t tot_failed_locate = 0 ;
            for(index_t t=0; t<threads_.size(); ++t) {
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                Logger::out("PDEL") 
                    << "thread " << std::setw(3) << t << " : " 
                    << std::setw(3) << thread->nb_rollbacks() << " rollbacks  "
                    << std::setw(3) << thread->nb_failed_locate() << " restarted locate"
                    << std::endl;
                tot_rollbacks += thread->nb_rollbacks();
                tot_failed_locate += thread->nb_failed_locate();
            }
            Logger::out("PDEL") << "------------------" << std::endl;
            Logger::out("PDEL") << "total: " 
                                << tot_rollbacks << " rollbacks  "
                                << tot_failed_locate << " restarted locate"
                                << std::endl;
        }

        // Run threads sequentialy, to insert missing points if
        // memory overflow was encountered (in sequential mode,
        // dynamic memory growing works)

        index_t nb_sequential_points = 0;
        for(index_t t=0; t<threads_.size(); ++t) {
            Delaunay3dThread* t1 = 
                static_cast<Delaunay3dThread*>(threads_[t].get());

            nb_sequential_points += t1->work_size();

            if(t != 0) {
                // We need to copy max_t_ from previous thread, 
                // since the memory pool may have grown.
                Delaunay3dThread* t2 = 
                    static_cast<Delaunay3dThread*>(threads_[t-1].get());
                t1->initialize_from(t2);
            }
            t1->run();
        }

        //  If some tetrahedra were created in sequential mode, then
        // the maximum valid tetrahedron index was increased by all
        // the threads in increasing number, so we copy it from the
        // last thread into thread0 since we use thread0 afterwards
        // to do the "compaction" afterwards.
        
        if(nb_sequential_points != 0) {
            Delaunay3dThread* t0 = 
                static_cast<Delaunay3dThread*>(threads_[0].get());
            Delaunay3dThread* tn = 
                static_cast<Delaunay3dThread*>(
                    threads_[threads_.size()-1].get()
                );
            t0->initialize_from(tn);
        }
        

        
        if(benchmark_mode_) {
            if(nb_sequential_points != 0) {
                Logger::out("PDEL") << "Local thread memory overflow occurred:"
                                    << std::endl;
                Logger::out("PDEL") << nb_sequential_points
                                    << " points inserted in sequential mode"
                                    << std::endl;
            } else {
                Logger::out("PDEL") 
                    << "All the points were inserted in parallel mode"
                    << std::endl;
            }
        }

        if(benchmark_mode_) {
            Logger::out("DelInternal2") << "Core insertion algo:"
                                       << W->elapsed_time() - sorting_time
                                       << std::endl;
        }
        delete W;

        if(debug_mode_) {
            for(index_t i=0; i<threads_.size(); ++i) {
                std::cerr << i << " : " <<
                    static_cast<Delaunay3dThread*>(threads_[i].get())
                    ->max_t() << std::endl;
            }
            
            thread0->check_combinatorics(verbose_debug_mode_);
            thread0->check_geometry(verbose_debug_mode_);
        }

        if(benchmark_mode_) {
            W = new Stopwatch("DelCompress");
        }

        //   Compress cell_to_v_store_ and cell_to_cell_store_
        // (remove free and virtual tetrahedra).
        //   Since cell_next_ is not used at this point,
        // we reuse it for storing the conversion array that
        // maps old tet indices to new tet indices
        // Note: tet_is_real() uses the previous value of 
        // cell_next(), but we are processing indices
        // in increasing order and since old2new[t] is always
        // smaller or equal to t, we never overwrite a value
        // before needing it.
        
        vector<index_t>& old2new = cell_next_;
        index_t nb_tets = 0;
        index_t nb_tets_to_delete = 0;

        {
            for(index_t t = 0; t < thread0->max_t(); ++t) {
                if(
                    (keep_infinite_ && !thread0->tet_is_free(t)) ||
                    thread0->tet_is_real(t)
                ) {
                    if(t != nb_tets) {
                        Memory::copy(
                            &cell_to_v_store_[nb_tets * 4],
                            &cell_to_v_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                        Memory::copy(
                            &cell_to_cell_store_[nb_tets * 4],
                            &cell_to_cell_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                    }
                    old2new[t] = nb_tets;
                    ++nb_tets;
                } else {
                    old2new[t] = index_t(-1);
                    ++nb_tets_to_delete;
                }
            }

            cell_to_v_store_.resize(4 * nb_tets);
            cell_to_cell_store_.resize(4 * nb_tets);
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                // Note: t can be equal to -1 when a real tet is
                // adjacent to a virtual one (and this is how the
                // rest of Vorpaline expects to see tets on the
                // border).
                geo_debug_assert(!(keep_infinite_ && t < 0));
                cell_to_cell_store_[i] = t;
            }
        }

        // In "keep_infinite" mode, we reorder the cells in such
        // a way that finite cells have indices [0..nb_finite_cells_-1]
        // and infinite cells have indices [nb_finite_cells_ .. nb_cells_-1]
        
        if(keep_infinite_) {
            nb_finite_cells_ = 0;
            index_t finite_ptr = 0;
            index_t infinite_ptr = nb_tets - 1;
            for(;;) {
                while(thread0->tet_is_finite(finite_ptr)) {
                    old2new[finite_ptr] = finite_ptr;
                    ++finite_ptr;
                    ++nb_finite_cells_;
                }
                while(!thread0->tet_is_finite(infinite_ptr)) {
                    old2new[infinite_ptr] = infinite_ptr;
                    --infinite_ptr;
                }
                if(finite_ptr > infinite_ptr) {
                    break;
                }
                old2new[finite_ptr] = infinite_ptr;
                old2new[infinite_ptr] = finite_ptr;
                ++nb_finite_cells_;
                for(index_t lf=0; lf<4; ++lf) {
                    std::swap(
                        cell_to_cell_store_[4*finite_ptr + lf],
                        cell_to_cell_store_[4*infinite_ptr + lf]
                    );
                }
                for(index_t lv=0; lv<4; ++lv) {
                    std::swap(
                        cell_to_v_store_[4*finite_ptr + lv],
                        cell_to_v_store_[4*infinite_ptr + lv]
                    );
                }
                ++finite_ptr;
                --infinite_ptr;
            }
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                geo_debug_assert(t >= 0);
                cell_to_cell_store_[i] = t;
            }
        }
        
        
        if(benchmark_mode_) {
            if(keep_infinite_) {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list)" << std::endl;
            } else {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list and infinite)" << std::endl;
            }
        }

        delete W;

        set_arrays(
            nb_tets,
            cell_to_v_store_.data(),
            cell_to_cell_store_.data()
        );
    }